

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductData.cpp
# Opt level: O2

string * convert_product_type(string *__return_storage_ptr__,string *optics_product_type)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  iterator iVar3;
  ostream *poVar4;
  runtime_error *this;
  allocator<char> aaStack_1f8 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  optics_types_to_new_types;
  stringstream err_msg;
  ostream local_198 [376];
  
  p_Var1 = &optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header;
  optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  optics_types_to_new_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  std::__cxx11::string::string<std::allocator<char>>((string *)&err_msg,"Monolithic",aaStack_1f8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&optics_types_to_new_types,(key_type *)&err_msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (pmVar2,"monolithic");
  std::__cxx11::string::~string((string *)&err_msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&err_msg,"Coated",aaStack_1f8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&optics_types_to_new_types,(key_type *)&err_msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (pmVar2,"coated-glass");
  std::__cxx11::string::~string((string *)&err_msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&err_msg,"Laminate",aaStack_1f8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&optics_types_to_new_types,(key_type *)&err_msg);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (pmVar2,"laminate");
  std::__cxx11::string::~string((string *)&err_msg);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&optics_types_to_new_types._M_t,optics_product_type);
  if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (iVar3._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&optics_types_to_new_types._M_t);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&err_msg);
  poVar4 = std::operator<<(local_198,"Unknown type in optics file: ");
  std::operator<<(poVar4,(string *)optics_product_type);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)aaStack_1f8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string convert_product_type(std::string const & optics_product_type)
{
    std::map<std::string, std::string> optics_types_to_new_types;
    optics_types_to_new_types["Monolithic"] = "monolithic";
    optics_types_to_new_types["Coated"] = "coated-glass";
    optics_types_to_new_types["Laminate"] = "laminate";

    std::map<std::string, std::string>::iterator itr =
      optics_types_to_new_types.find(optics_product_type);

    if(itr != optics_types_to_new_types.end())
    {
        return itr->second;
    }
    else
    {
        std::stringstream err_msg;
        err_msg << "Unknown type in optics file: " << optics_product_type;
        throw std::runtime_error(err_msg.str());
    }
}